

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeStartMouseMovingWindow(ImGuiDockNode *node,ImGuiWindow *window)

{
  ImGuiContext_conflict *pIVar1;
  ImVec2 IVar2;
  ImGuiContext_conflict *g;
  ImGuiWindow *window_local;
  ImGuiDockNode *node_local;
  
  pIVar1 = GImGui;
  if ((node->field_0xbe & 1) == 1) {
    StartMouseMovingWindow(window);
    IVar2 = operator-((pIVar1->IO).MouseClickedPos,&node->Pos);
    pIVar1->ActiveIdClickOffset = IVar2;
    pIVar1->MovingWindow = window;
    node->field_0xbe = node->field_0xbe & 0xfe;
    return;
  }
  __assert_fail("node->WantMouseMove == true",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x3628,"void ImGui::DockNodeStartMouseMovingWindow(ImGuiDockNode *, ImGuiWindow *)"
               );
}

Assistant:

static void ImGui::DockNodeStartMouseMovingWindow(ImGuiDockNode* node, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->WantMouseMove == true);
    StartMouseMovingWindow(window);
    g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - node->Pos;
    g.MovingWindow = window; // If we are docked into a non moveable root window, StartMouseMovingWindow() won't set g.MovingWindow. Override that decision.
    node->WantMouseMove = false;
}